

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

void __thiscall
Circuit::base_circuit_shares
          (Circuit *this,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_in,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *output_mult_shares,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *witness_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *right_input_mult_shares_out,
          vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
          *left_input_mult_shares_out)

{
  pointer puVar1;
  pointer paVar2;
  pointer pGVar3;
  pointer pvVar4;
  pointer pvVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  pointer puVar9;
  runtime_error *this_00;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> W;
  allocator_type local_71;
  Circuit *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_> *local_50
  ;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_50 = witness_shares_out;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,(ulong)this->nWires,&local_71);
  puVar1 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)(this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar10 != 0) {
    paVar2 = (witness_shares_in->
             super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar11 = 0;
    do {
      for (uVar14 = puVar1[uVar12]; uVar14 != 0; uVar14 = uVar14 - 1) {
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = paVar2[uVar11]._M_elems[0];
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < (ulong)(lVar10 >> 2));
  }
  pGVar3 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pGVar3;
  local_70 = this;
  if (lVar10 != 0) {
    pvVar4 = (this->GateI).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->GateO).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (right_input_mult_shares_out->
               super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_40 = (left_input_mult_shares_out->
               super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    local_48 = (output_mult_shares->
               super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar14 = 0;
    do {
      switch(pGVar3[uVar11]) {
      case XOR:
        puVar6 = pvVar4[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[puVar6[1]] ^
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*puVar6];
        break;
      case AND:
        puVar6 = pvVar4[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_38[uVar14]._M_elems[0] =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[*puVar6];
        local_40[uVar14]._M_elems[0] =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[puVar6[1]];
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start
        [*pvVar5[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start] = local_48[uVar14]._M_elems[0];
        uVar14 = uVar14 + 1;
        goto LAB_00104d30;
      case INV:
        uVar12 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*pvVar4[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start] ^ 1;
        break;
      case EQ:
        uVar12 = (ulong)*pvVar4[uVar11].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        break;
      case EQW:
        uVar12 = local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*pvVar4[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start];
        break;
      case MAND:
        lVar7 = *(long *)&pvVar5[uVar11].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data;
        puVar1 = *(pointer *)
                  ((long)&pvVar5[uVar11].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        lVar16 = (long)puVar1 - lVar7;
        if (lVar16 != 0) {
          lVar8 = *(long *)&pvVar4[uVar11].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          uVar12 = 0;
          do {
            local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*(uint *)(lVar7 + uVar12 * 4)] =
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)(lVar16 + lVar8 + uVar12 * 4)] &
                 local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*(uint *)(lVar8 + uVar12 * 4)];
            uVar12 = uVar12 + 1;
          } while ((uVar12 & 0xffffffff) < (ulong)((long)puVar1 - lVar7 >> 2));
        }
        goto LAB_00104d30;
      default:
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"not_implemented");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start
      [*pvVar5[uVar11].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start] = uVar12;
LAB_00104d30:
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (uVar11 < (ulong)(lVar10 >> 2));
  }
  puVar1 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar9 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)puVar1 - (long)puVar9 >> 2;
  uVar14 = this->nWires;
  if (puVar1 != puVar9) {
    uVar12 = 0;
    do {
      uVar14 = uVar14 - puVar9[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < uVar11);
  }
  if (puVar1 != puVar9) {
    paVar2 = (local_50->
             super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar12 = 0;
    do {
      for (uVar15 = puVar9[uVar13]; uVar15 != 0; uVar15 = uVar15 - 1) {
        paVar2[uVar12]._M_elems[0] =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar14];
        uVar14 = uVar14 + 1;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      uVar13 = uVar13 + 1;
    } while ((uVar13 & 0xffffffff) < uVar11);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Circuit::base_circuit_shares(
    const std::vector<std::array<uint64_t, PARTY64>> &witness_shares_in,
    const std::vector<std::array<uint64_t, PARTY64>> &output_mult_shares,
    std::vector<std::array<uint64_t, PARTY64>> &witness_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &right_input_mult_shares_out,
    std::vector<std::array<uint64_t, PARTY64>> &left_input_mult_shares_out)
    const {
  vector<uint64_t> W(nWires);
  for (unsigned int p = 0; p < PARTY64; p++) {
    unsigned int cntAND = 0;
    // Load inputs
    unsigned int cnt = 0;
    for (unsigned int i = 0; i < numI.size(); i++) {
      for (unsigned int j = 0; j < numI[i]; j++) {
        W[cnt] = witness_shares_in[cnt][p];
        cnt++;
      }
    }
    // Evaluate the circuit
    for (unsigned int i = 0; i < GateT.size();
         i++) { // First check if ordering is broken
      // if (GateT[i] != EQ && W[GateI[i][0]] < 0)
      //  {
      //    throw std::runtime_error("Circuit error");
      //  }
      // if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW)
      //  {
      //    for (unsigned int j= 1; j < GateO[i].size(); j++)
      //      {
      //        if (W[GateI[i][j]] < 0)
      //          {
      //            throw std::runtime_error("Circuit error");
      //          }
      //      }
      //  }
      // Now evaluate the gate
      if (GateT[i] == AND) {
        right_input_mult_shares_out[cntAND][p] = W[GateI[i][0]];
        left_input_mult_shares_out[cntAND][p] = W[GateI[i][1]];
        W[GateO[i][0]] = output_mult_shares[cntAND][p];
        cntAND++;
      } else if (GateT[i] == MAND) {
        for (unsigned int j = 0; j < GateO[i].size(); j++) {
          W[GateO[i][j]] = W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
        }
      } else if (GateT[i] == XOR) {
        W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
      } else if (GateT[i] == EQ) {
        W[GateO[i][0]] = GateI[i][0];
      } else if (GateT[i] == EQW) {
        W[GateO[i][0]] = W[GateI[i][0]];
      } else if (GateT[i] == INV) {
        W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
      } else {
        throw std::runtime_error("not_implemented");
      }
    }
    // Now produce the output
    // outputs.resize(total_num_out());
    cnt = nWires;
    unsigned int cntOut = 0;
    for (unsigned int i = 0; i < numO.size(); i++) {
      cnt -= numO[i];
    }
    for (unsigned int i = 0; i < numO.size(); i++) {
      // outputs[i].resize(numO[i]);
      for (unsigned int j = 0; j < numO[i]; j++) {
        witness_shares_out[cntOut][p] = W[cnt];
        cnt++;
        cntOut++;
      }
    }
  }
}